

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O3

int __thiscall Js::BigUInt::DivRem(BigUInt *this,BigUInt *pbi)

{
  uint uVar1;
  code *pcVar2;
  uint32 uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  uint32 lu2;
  ulong uVar9;
  long lVar10;
  uint32 local_40;
  uint local_3c;
  uint32 luT;
  uint local_34;
  uint32 luLo;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1c1,"(pbi)","pbi");
    if (!bVar4) goto LAB_0068e98d;
    *puVar7 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1c2,"(this != pbi)","this != pbi");
    if (!bVar4) goto LAB_0068e98d;
    *puVar7 = 0;
  }
  uVar1 = pbi->m_clu;
  uVar9 = (ulong)uVar1;
  iVar6 = this->m_clu;
  if ((int)uVar1 < iVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1cb,"(m_clu <= clu)","m_clu <= clu");
    if (!bVar4) goto LAB_0068e98d;
    *puVar7 = 0;
    iVar6 = this->m_clu;
  }
  if ((int)uVar1 < 1) {
    return 0;
  }
  if (iVar6 < (int)uVar1) {
    return 0;
  }
  local_34 = this->m_prglu[uVar1 - 1] / (pbi->m_prglu[uVar1 - 1] + 1);
  if (9 < local_34) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1d1,"(wQuo >= 0 && wQuo <= 9)","wQuo >= 0 && wQuo <= 9");
    if (!bVar4) goto LAB_0068e98d;
    *puVar7 = 0;
  }
  if (local_34 == 0) {
LAB_0068e8f2:
    iVar6 = Compare(this,pbi);
    if (-1 < iVar6) {
      local_34 = local_34 + 1;
      if (iVar6 == 0) {
        this->m_clu = 0;
      }
      else {
        Subtract(this,pbi);
      }
    }
  }
  else {
    if (local_34 == 1) {
      Subtract(this,pbi);
      goto LAB_0068e8f2;
    }
    uVar5 = 1;
    lVar10 = 0;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lu2 = 0;
    uVar8 = uVar9;
    do {
      if (1 < uVar5) {
        AssertCount = AssertCount + 1;
        local_3c = uVar5;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                    ,0x1e0,"(wCarry == 0 || wCarry == 1)",
                                    "wCarry == 0 || wCarry == 1");
        if (!bVar4) goto LAB_0068e98d;
        *puVar7 = 0;
        uVar5 = local_3c;
      }
      luT = NumberUtilities::MulLu(local_34,*(uint32 *)((long)pbi->m_prglu + lVar10),&local_40);
      uVar3 = local_40;
      iVar6 = NumberUtilities::AddLu(&luT,lu2);
      if ((luT != 0) || (uVar5 == 0)) {
        uVar5 = NumberUtilities::AddLu((uint32 *)((long)this->m_prglu + lVar10),uVar5 + ~luT);
      }
      lu2 = iVar6 + uVar3;
      lVar10 = lVar10 + 4;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    if (uVar5 != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x1ea,"(1 == wCarry)","1 == wCarry");
      if (!bVar4) goto LAB_0068e98d;
      *puVar7 = 0;
    }
    iVar6 = uVar1 + 1;
    do {
      if ((long)uVar9 < 1) {
        iVar6 = 0;
        break;
      }
      iVar6 = iVar6 + -1;
      lVar10 = uVar9 - 1;
      uVar9 = uVar9 - 1;
    } while (this->m_prglu[lVar10] == 0);
    this->m_clu = iVar6;
    if ((int)local_34 < 9) goto LAB_0068e8f2;
  }
  iVar6 = Compare(this,pbi);
  if (-1 < iVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1fc,"(Compare(pbi) < 0)","Compare(pbi) < 0");
    if (!bVar4) {
LAB_0068e98d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return local_34;
}

Assistant:

int BigUInt::DivRem(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 ilu, clu;
        int wCarry;
        int wQuo;
        int wT;
        uint32 luT, luHi, luLo;

        clu = pbi->m_clu;
        Assert(m_clu <= clu);
        if ((m_clu < clu) || (clu <= 0))
            return 0;

        // Get a lower bound on the quotient.
        wQuo = (int)(m_prglu[clu - 1] / (pbi->m_prglu[clu - 1] + 1));
        Assert(wQuo >= 0 && wQuo <= 9);

        // Handle 0 and 1 as special cases.
        switch (wQuo)
        {
        case 0:
            break;
        case 1:
            Subtract(pbi);
            break;
        default:
            luHi = 0;
            wCarry = 1;
            for (ilu = 0; ilu < clu; ilu++)
            {
                Assert(wCarry == 0 || wCarry == 1);

                // Compute the product.
                luLo = NumberUtilities::MulLu(wQuo, pbi->m_prglu[ilu], &luT);
                luHi = luT + NumberUtilities::AddLu(&luLo, luHi);

                // Subtract the product. See note in BigInt::Subtract.
                if (0 != luLo || 0 == wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], ~luLo + wCarry);
            }
            Assert(1 == wCarry);
            Assert(ilu == clu);

            // Trim off zeros.
            while (--ilu >= 0 && 0 == m_prglu[ilu])
                ;
            m_clu = ilu + 1;
        }

        if (wQuo < 9 && (wT = Compare(pbi)) >= 0)
        {
            // Quotient was off too small (by one).
            wQuo++;
            if (wT == 0)
                m_clu = 0;
            else
                Subtract(pbi);
        }
        Assert(Compare(pbi) < 0);

        return wQuo;
    }